

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode ipv6_parse(Curl_URL *u,char *hostname,size_t hlen)

{
  bool bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char local_98 [8];
  char norm [46];
  char dest [16];
  char *h;
  char local_48 [4];
  int i;
  char zoneid [16];
  size_t len;
  size_t hlen_local;
  char *hostname_local;
  Curl_URL *u_local;
  
  if (hlen < 4) {
    return CURLUE_BAD_IPV6;
  }
  __s = hostname + 1;
  sVar3 = strspn(__s,"0123456789abcdefABCDEF:.");
  len = hlen - 2;
  if (hlen - 2 != sVar3) {
    if (__s[sVar3] != '%') {
      return CURLUE_BAD_IPV6;
    }
    h._4_4_ = 0;
    dest._8_8_ = __s + sVar3 + 1;
    iVar2 = strncmp((char *)dest._8_8_,"25",2);
    if (((iVar2 == 0) && (*(char *)(dest._8_8_ + 2) != '\0')) && (*(char *)(dest._8_8_ + 2) != ']'))
    {
      dest._8_8_ = dest._8_8_ + 2;
    }
    while( true ) {
      bVar1 = false;
      if ((*(char *)dest._8_8_ != '\0') && (bVar1 = false, *(char *)dest._8_8_ != ']')) {
        bVar1 = h._4_4_ < 0xf;
      }
      if (!bVar1) break;
      local_48[h._4_4_] = *(char *)dest._8_8_;
      dest._8_8_ = dest._8_8_ + 1;
      h._4_4_ = h._4_4_ + 1;
    }
    if ((h._4_4_ == 0) || (*(char *)dest._8_8_ != ']')) {
      return CURLUE_BAD_IPV6;
    }
    local_48[h._4_4_] = '\0';
    pcVar4 = (*Curl_cstrdup)(local_48);
    u->zoneid = pcVar4;
    if (u->zoneid == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    __s[sVar3] = ']';
    hostname[sVar3 + 2] = '\0';
    len = sVar3;
  }
  __s[len] = '\0';
  iVar2 = inet_pton(10,__s,norm + 0x28);
  if (iVar2 == 1) {
    pcVar4 = inet_ntop(10,norm + 0x28,local_98,0x2e);
    if ((pcVar4 != (char *)0x0) && (sVar3 = strlen(local_98), sVar3 < len)) {
      strcpy(__s,local_98);
      len = strlen(local_98);
      hostname[len + 2] = '\0';
    }
    __s[len] = ']';
    u_local._4_4_ = CURLUE_OK;
  }
  else {
    u_local._4_4_ = CURLUE_BAD_IPV6;
  }
  return u_local._4_4_;
}

Assistant:

static CURLUcode ipv6_parse(struct Curl_URL *u, char *hostname,
                            size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(*hostname == '[');
  if(hlen < 4) /* '[::]' is the shortest possible valid string */
    return CURLUE_BAD_IPV6;
  hostname++;
  hlen -= 2;

  /* only valid IPv6 letters are ok */
  len = strspn(hostname, "0123456789abcdefABCDEF:.");

  if(hlen != len) {
    hlen = len;
    if(hostname[len] == '%') {
      /* this could now be '%[zone id]' */
      char zoneid[16];
      int i = 0;
      char *h = &hostname[len + 1];
      /* pass '25' if present and is a url encoded percent sign */
      if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
        h += 2;
      while(*h && (*h != ']') && (i < 15))
        zoneid[i++] = *h++;
      if(!i || (']' != *h))
        return CURLUE_BAD_IPV6;
      zoneid[i] = 0;
      u->zoneid = strdup(zoneid);
      if(!u->zoneid)
        return CURLUE_OUT_OF_MEMORY;
      hostname[len] = ']'; /* insert end bracket */
      hostname[len + 1] = 0; /* terminate the hostname */
    }
    else
      return CURLUE_BAD_IPV6;
    /* hostname is fine */
  }

  /* Check the IPv6 address. */
  {
    char dest[16]; /* fits a binary IPv6 address */
    char norm[MAX_IPADR_LEN];
    hostname[hlen] = 0; /* end the address there */
    if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
      return CURLUE_BAD_IPV6;

    /* check if it can be done shorter */
    if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
       (strlen(norm) < hlen)) {
      strcpy(hostname, norm);
      hlen = strlen(norm);
      hostname[hlen + 1] = 0;
    }
    hostname[hlen] = ']'; /* restore ending bracket */
  }
  return CURLUE_OK;
}